

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_key_value_pair<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  ulong uVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  
  peVar2 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (loc->location_ < uVar4) {
    sVar6 = loc->line_number_;
    sVar7 = loc->column_number_;
    uVar5 = loc->location_;
    while (*(char *)(lVar3 + uVar5) != '\n') {
      if (*(char *)(lVar3 + uVar5) == '=') {
        skip_whitespace<toml::type_config>(loc,ctx);
        skip_value<toml::type_config>(loc,ctx);
        return;
      }
      uVar1 = uVar5 + 1;
      if (uVar4 <= uVar1) {
        do {
          if (*(char *)(lVar3 + uVar5) == '\n') {
            sVar6 = sVar6 + 1;
            loc->line_number_ = sVar6;
            sVar7 = 1;
          }
          else {
            sVar7 = sVar7 + 1;
          }
          loc->column_number_ = sVar7;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
        loc->location_ = uVar4;
        return;
      }
      sVar7 = sVar7 + 1;
      loc->column_number_ = sVar7;
      loc->location_ = uVar1;
      uVar5 = uVar1;
    }
  }
  return;
}

Assistant:

void skip_key_value_pair(location& loc, const context<TC>& ctx)
{
    while( ! loc.eof())
    {
        if(loc.current() == '=')
        {
            skip_whitespace(loc, ctx);
            skip_value(loc, ctx);
            return;
        }
        else if(loc.current() == '\n')
        {
            // newline is found before finding `=`. assuming "missing `=`".
            return;
        }
        loc.advance();
    }
    return ;
}